

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wfc.cpp
# Opt level: O1

Array2D<unsigned_int> * __thiscall
WFC::wave_to_output(Array2D<unsigned_int> *__return_storage_ptr__,WFC *this)

{
  ulong uVar1;
  size_t sVar2;
  pointer puVar3;
  pointer puVar4;
  ulong uVar5;
  ulong uVar6;
  
  Array2D<unsigned_int>::Array2D
            (__return_storage_ptr__,(ulong)(this->wave).height,(ulong)(this->wave).width);
  if ((this->wave).size != 0) {
    uVar1 = this->nb_patterns;
    sVar2 = (this->wave).data.width;
    puVar4 = (this->wave).data.data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = 0;
    do {
      if (uVar1 != 0) {
        puVar3 = (__return_storage_ptr__->data).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar6 = 0;
        do {
          if (puVar4[uVar6] != '\0') {
            puVar3[uVar5] = (uint)uVar6;
          }
          uVar6 = uVar6 + 1;
        } while ((uVar6 & 0xffffffff) < uVar1);
      }
      uVar5 = uVar5 + 1;
      puVar4 = puVar4 + sVar2;
    } while (uVar5 < (this->wave).size);
  }
  return __return_storage_ptr__;
}

Assistant:

Array2D<unsigned> WFC::wave_to_output() const noexcept {
  Array2D<unsigned> output_patterns(wave.height, wave.width);
  for (unsigned i = 0; i < wave.size; i++) {
    for (unsigned k = 0; k < nb_patterns; k++) {
      if (wave.get(i, k)) {
        output_patterns.data[i] = k;
      }
    }
  }
  return output_patterns;
}